

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cpp
# Opt level: O0

void __thiscall bitboards::printStandardArrayBoard(bitboards *this)

{
  int local_68;
  int local_64;
  int x;
  int y;
  int i;
  int i_1;
  char array [64];
  bitboards *this_local;
  
  for (y = 0; y < 0x40; y = y + 1) {
    *(undefined1 *)((long)&i + (long)y) = 0x20;
  }
  convertToStandardArray(this,(char *)&i);
  x = 0;
  for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
      std::operator<<((ostream *)&std::cout,*(char *)((long)&i + (long)x));
      x = x + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void bitboards::printStandardArrayBoard() {
  char array[64];
  for (int i=0; i < 64; i++) {
    array[i] = ' ';
  }

  convertToStandardArray(array);

  int i = 0;
  for(int y = 0; y < 8; y++) {
    for(int x = 0; x < 8; x++, i++) {
      std::cout << array[i];
    }
    std::cout << std::endl;
  }
}